

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

EntryInstr * IR::EntryInstr::New(OpCode opcode,Func *func)

{
  JitArenaAllocator *pJVar1;
  Instr *this;
  TrackAllocData local_48;
  Instr *local_20;
  EntryInstr *entryInstr;
  Func *func_local;
  OpCode opcode_local;
  
  pJVar1 = func->m_alloc;
  entryInstr = (EntryInstr *)func;
  func_local._6_2_ = opcode;
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_48,(type_info *)&typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.cpp"
             ,0x60a);
  pJVar1 = (JitArenaAllocator *)
           Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
           TrackAllocInfo((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pJVar1,&local_48);
  this = (Instr *)new<Memory::JitArenaAllocator>(0x58,pJVar1,0x4e98c0);
  memset(this,0,0x58);
  EntryInstr((EntryInstr *)this);
  local_20 = this;
  Instr::Init(this,func_local._6_2_,InstrKindEntry,(Func *)entryInstr);
  return (EntryInstr *)local_20;
}

Assistant:

EntryInstr *
EntryInstr::New(Js::OpCode opcode, Func *func)
{
    EntryInstr * entryInstr;

    entryInstr = JitAnew(func->m_alloc, IR::EntryInstr);
    entryInstr->Init(opcode, InstrKindEntry, func);
    return entryInstr;
}